

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.hpp
# Opt level: O2

void __thiscall Mine::~Mine(Mine *this)

{
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00116b18;
  std::__cxx11::string::~string((string *)&this->name);
  Holding::~Holding(&this->super_Holding);
  return;
}

Assistant:

virtual ~Mine() {}